

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void __thiscall TCMallocGuard::~TCMallocGuard(TCMallocGuard *this)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  
  tcmallocguard_refcount = tcmallocguard_refcount + -1;
  if (tcmallocguard_refcount == 0) {
    iVar1 = RunningOnValgrind();
    if (iVar1 == 0) {
      __nptr = getenv("MALLOCSTATS");
      if (__nptr != (char *)0x0) {
        iVar2 = atoi(__nptr);
        iVar1 = 1;
        if (1 < iVar2) {
          iVar1 = iVar2;
        }
        PrintStats(iVar1);
      }
    }
  }
  return;
}

Assistant:

TCMallocGuard::~TCMallocGuard() {
  if (--tcmallocguard_refcount == 0) {
    const char* env = nullptr;
    if (!RunningOnValgrind()) {
      // Valgrind uses it's own malloc so we cannot do MALLOCSTATS
      env = getenv("MALLOCSTATS");
    }
    if (env != nullptr) {
      int level = atoi(env);
      if (level < 1) level = 1;
      PrintStats(level);
    }
  }
}